

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  ulong uVar13;
  BBox3fa *pBVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  char *pcVar21;
  size_t sVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar45;
  float fVar46;
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar44;
  float fVar51;
  float fVar52;
  undefined1 auVar48 [16];
  float fVar53;
  undefined1 auVar49 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar50;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_188;
  size_t local_180;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_110;
  anon_class_16_2_07cfa4d6 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar3 = time_range->lower;
  if (time_range->lower <= fVar2) {
    fVar3 = fVar2;
  }
  fVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper;
  if (time_range->upper <= fVar2) {
    fVar2 = time_range->upper;
  }
  if (fVar3 <= fVar2) {
    uVar23 = r->_begin;
    local_138 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_148 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_158 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    local_168 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_188 = __return_storage_ptr__->end;
    if (uVar23 < r->_end) {
      local_180 = k;
      do {
        BVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        fVar41 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar43._0_4_ = BVar4.lower;
        auVar43._8_4_ = BVar4.upper - auVar43._0_4_;
        auVar43._4_4_ = floorf(((fVar3 - auVar43._0_4_) / auVar43._8_4_) * 1.0000002 * fVar41);
        auVar43._0_4_ = ceilf(((fVar2 - auVar43._0_4_) / auVar43._8_4_) * 0.99999976 * fVar41);
        uVar16 = *(uint *)(*(long *)&(this->
                                     super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar23);
        uVar13 = (ulong)uVar16;
        uVar15 = (ulong)(uVar16 + 1);
        pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar15 < (pBVar5->super_RawBufferView).num) {
          auVar43._8_4_ = 0.0;
          if (0.0 <= auVar43._4_4_) {
            auVar43._8_4_ = auVar43._4_4_;
          }
          uVar16 = (uint)auVar43._8_4_;
          if (fVar41 <= auVar43._0_4_) {
            auVar43._0_4_ = fVar41;
          }
          uVar19 = (uint)auVar43._0_4_;
          bVar9 = uVar19 < uVar16;
          if (uVar16 <= uVar19) {
            uVar17 = (ulong)(int)uVar16;
            lVar18 = uVar17 * 0x38;
            pcVar21 = pBVar5[uVar17].super_RawBufferView.ptr_ofs;
            sVar22 = pBVar5[uVar17].super_RawBufferView.stride;
            pfVar1 = (float *)(pcVar21 + sVar22 * uVar13);
            auVar33._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
            auVar33._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
            auVar33._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
            auVar33._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
            auVar49._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
            auVar49._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
            auVar49._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
            auVar49._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
            iVar20 = movmskps((int)(sVar22 * uVar13),auVar49 | auVar33);
            if (iVar20 == 0) {
              pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.tangents.items;
              do {
                pfVar1 = (float *)(pcVar21 + sVar22 * uVar15);
                auVar34._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
                auVar34._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
                auVar34._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
                auVar34._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
                auVar26._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
                auVar26._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
                auVar26._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
                auVar26._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
                iVar20 = movmskps((int)pcVar21,auVar26 | auVar34);
                if (iVar20 != 0) break;
                lVar7 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar18);
                lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar18);
                pfVar1 = (float *)(lVar7 + lVar8 * uVar13);
                auVar35._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
                auVar35._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
                auVar35._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
                auVar35._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
                auVar27._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
                auVar27._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
                auVar27._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
                auVar27._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
                uVar12 = SUB84(&local_108,0);
                iVar20 = movmskps(uVar12,auVar27 | auVar35);
                if (iVar20 != 0) break;
                pfVar1 = (float *)(lVar7 + lVar8 * uVar15);
                auVar36._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
                auVar36._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
                auVar36._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
                auVar36._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
                auVar28._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
                auVar28._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
                auVar28._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
                auVar28._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
                iVar20 = movmskps((int)lVar7,auVar28 | auVar36);
                if (iVar20 != 0) break;
                uVar17 = uVar17 + 1;
                bVar9 = (ulong)(long)(int)uVar19 < uVar17;
                if ((ulong)(long)(int)uVar19 < uVar17) goto LAB_00a94b16;
                pcVar21 = *(char **)((long)&pBVar5[1].super_RawBufferView.ptr_ofs + lVar18);
                sVar22 = *(size_t *)((long)&pBVar5[1].super_RawBufferView.stride + lVar18);
                lVar18 = lVar18 + 0x38;
                pfVar1 = (float *)(pcVar21 + sVar22 * uVar13);
                auVar37._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
                auVar37._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
                auVar37._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
                auVar37._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
                auVar29._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
                auVar29._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
                auVar29._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
                auVar29._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
                iVar20 = movmskps(uVar12,auVar29 | auVar37);
              } while (iVar20 == 0);
            }
            if (!bVar9) goto LAB_00a94f80;
          }
LAB_00a94b16:
          local_108.primID = &local_110;
          auVar43._0_4_ =
               (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.super_Geometry.time_range.lower;
          fVar30 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.upper - auVar43._0_4_;
          fVar38 = (fVar3 - auVar43._0_4_) / fVar30;
          fVar30 = (fVar2 - auVar43._0_4_) / fVar30;
          auVar43._12_4_ = fVar41 * fVar30;
          local_110 = uVar23;
          local_108.this = this;
          auVar43._4_4_ = floorf(fVar41 * fVar38);
          auVar43._8_4_ = ceilf(auVar43._12_4_);
          auVar43._0_4_ = auVar43._4_4_;
          if (auVar43._4_4_ <= 0.0) {
            auVar43._0_4_ = 0.0;
          }
          auVar31._12_4_ = auVar43._8_4_;
          if (fVar41 <= auVar43._8_4_) {
            auVar31._12_4_ = fVar41;
          }
          uVar16 = (int)auVar43._4_4_;
          if ((int)auVar43._4_4_ < 0) {
            uVar16 = 0xffffffff;
          }
          iVar20 = (int)fVar41 + 1;
          if ((int)auVar43._8_4_ < (int)fVar41 + 1) {
            iVar20 = (int)auVar43._8_4_;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_d8.field_1,&local_108,(long)(int)auVar43._0_4_);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_f8.field_1,&local_108,(long)(int)auVar31._12_4_);
          auVar43._4_4_ = fVar41 * fVar38 - auVar43._0_4_;
          if (iVar20 - uVar16 == 1) {
            if (auVar43._4_4_ <= 0.0) {
              auVar43._4_4_ = 0.0;
            }
            fVar41 = 1.0 - auVar43._4_4_;
            auVar48._0_4_ = fVar41 * local_d8.m128[0] + auVar43._4_4_ * local_f8.m128[0];
            auVar48._4_4_ = fVar41 * local_d8.m128[1] + auVar43._4_4_ * local_f8.m128[1];
            auVar48._8_4_ = fVar41 * local_d8.m128[2] + auVar43._4_4_ * local_f8.m128[2];
            auVar48._12_4_ = fVar41 * local_d8.m128[3] + auVar43._4_4_ * local_f8.m128[3];
            auVar42._0_4_ = fVar41 * local_c8 + auVar43._4_4_ * local_e8;
            auVar42._4_4_ = fVar41 * fStack_c4 + auVar43._4_4_ * fStack_e4;
            auVar42._8_4_ = fVar41 * fStack_c0 + auVar43._4_4_ * fStack_e0;
            auVar42._12_4_ = fVar41 * fStack_bc + auVar43._4_4_ * fStack_dc;
            auVar31._12_4_ = auVar31._12_4_ - auVar43._12_4_;
            if (auVar31._12_4_ <= 0.0) {
              auVar31._12_4_ = 0.0;
            }
            fVar41 = 1.0 - auVar31._12_4_;
            auVar43._0_4_ = local_f8.m128[0] * fVar41 + local_d8.m128[0] * auVar31._12_4_;
            auVar43._4_4_ = local_f8.m128[1] * fVar41 + local_d8.m128[1] * auVar31._12_4_;
            auVar43._8_4_ = local_f8.m128[2] * fVar41 + local_d8.m128[2] * auVar31._12_4_;
            auVar43._12_4_ = local_f8.m128[3] * fVar41 + local_d8.m128[3] * auVar31._12_4_;
            auVar31._0_4_ = fVar41 * local_e8 + auVar31._12_4_ * local_c8;
            auVar31._4_4_ = fVar41 * fStack_e4 + auVar31._12_4_ * fStack_c4;
            auVar31._8_4_ = fVar41 * fStack_e0 + auVar31._12_4_ * fStack_c0;
            auVar31._12_4_ = fVar41 * fStack_dc + auVar31._12_4_ * fStack_bc;
            uVar19 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_108,(long)((int)auVar43._0_4_ + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_108,(long)((int)auVar31._12_4_ + -1));
            if (auVar43._4_4_ <= 0.0) {
              auVar43._4_4_ = 0.0;
            }
            auVar43._0_4_ = 1.0 - auVar43._4_4_;
            auVar48._0_4_ = local_d8.m128[0] * auVar43._0_4_ + local_58.m128[0] * auVar43._4_4_;
            auVar48._4_4_ = local_d8.m128[1] * auVar43._0_4_ + local_58.m128[1] * auVar43._4_4_;
            auVar48._8_4_ = local_d8.m128[2] * auVar43._0_4_ + local_58.m128[2] * auVar43._4_4_;
            auVar48._12_4_ = local_d8.m128[3] * auVar43._0_4_ + local_58.m128[3] * auVar43._4_4_;
            auVar42._0_4_ = auVar43._0_4_ * local_c8 + auVar43._4_4_ * local_48;
            auVar42._4_4_ = auVar43._0_4_ * fStack_c4 + auVar43._4_4_ * fStack_44;
            auVar42._8_4_ = auVar43._0_4_ * fStack_c0 + auVar43._4_4_ * fStack_40;
            auVar42._12_4_ = auVar43._0_4_ * fStack_bc + auVar43._4_4_ * fStack_3c;
            auVar31._12_4_ = auVar31._12_4_ - auVar43._12_4_;
            if (auVar31._12_4_ <= 0.0) {
              auVar31._12_4_ = 0.0;
            }
            fVar40 = 1.0 - auVar31._12_4_;
            auVar43._0_4_ = local_f8.m128[0] * fVar40 + local_78.m128[0] * auVar31._12_4_;
            auVar43._4_4_ = local_f8.m128[1] * fVar40 + local_78.m128[1] * auVar31._12_4_;
            auVar43._8_4_ = local_f8.m128[2] * fVar40 + local_78.m128[2] * auVar31._12_4_;
            auVar43._12_4_ = local_f8.m128[3] * fVar40 + local_78.m128[3] * auVar31._12_4_;
            auVar31._0_4_ = fVar40 * local_e8 + auVar31._12_4_ * local_68;
            auVar31._4_4_ = fVar40 * fStack_e4 + auVar31._12_4_ * fStack_64;
            auVar31._8_4_ = fVar40 * fStack_e0 + auVar31._12_4_ * fStack_60;
            auVar31._12_4_ = fVar40 * fStack_dc + auVar31._12_4_ * fStack_5c;
            uVar19 = uVar16 + 1;
            if ((int)uVar19 < iVar20) {
              sVar22 = (size_t)uVar19;
              iVar20 = ~uVar16 + iVar20;
              do {
                fVar40 = ((float)(int)sVar22 / fVar41 - fVar38) / (fVar30 - fVar38);
                fVar39 = 1.0 - fVar40;
                fVar51 = auVar48._4_4_;
                fVar52 = auVar48._8_4_;
                fVar53 = auVar48._12_4_;
                fVar45 = auVar42._4_4_;
                fVar46 = auVar42._8_4_;
                fVar47 = auVar42._12_4_;
                local_a8 = fVar39 * auVar42._0_4_ + fVar40 * auVar31._0_4_;
                fStack_a4 = fVar39 * fVar45 + fVar40 * auVar31._4_4_;
                fStack_a0 = fVar39 * fVar46 + fVar40 * auVar31._8_4_;
                fStack_9c = fVar39 * fVar47 + fVar40 * auVar31._12_4_;
                local_b8 = auVar43._0_4_;
                fStack_b4 = auVar43._4_4_;
                fStack_b0 = auVar43._8_4_;
                fStack_ac = auVar43._12_4_;
                pBVar14 = linearBounds::anon_class_16_2_07cfa4d6::operator()
                                    ((BBox3fa *)&local_98.field_1,&local_108,sVar22);
                uVar19 = (uint)pBVar14;
                auVar24._0_4_ = local_98.m128[0] - (auVar48._0_4_ * fVar39 + auVar43._0_4_ * fVar40)
                ;
                auVar24._4_4_ = local_98.m128[1] - (fVar51 * fVar39 + auVar43._4_4_ * fVar40);
                auVar24._8_4_ = local_98.m128[2] - (fVar52 * fVar39 + auVar43._8_4_ * fVar40);
                auVar24._12_4_ = local_98.m128[3] - (fVar53 * fVar39 + auVar43._12_4_ * fVar40);
                auVar32._0_4_ = local_88 - local_a8;
                auVar32._4_4_ = fStack_84 - fStack_a4;
                auVar32._8_4_ = fStack_80 - fStack_a0;
                auVar32._12_4_ = fStack_7c - fStack_9c;
                auVar49 = minps(auVar24,ZEXT816(0));
                auVar33 = maxps(auVar32,ZEXT816(0));
                auVar48._0_4_ = auVar48._0_4_ + auVar49._0_4_;
                auVar48._4_4_ = fVar51 + auVar49._4_4_;
                auVar48._8_4_ = fVar52 + auVar49._8_4_;
                auVar48._12_4_ = fVar53 + auVar49._12_4_;
                auVar43._0_4_ = auVar49._0_4_ + local_b8;
                auVar43._4_4_ = auVar49._4_4_ + fStack_b4;
                auVar43._8_4_ = auVar49._8_4_ + fStack_b0;
                auVar43._12_4_ = auVar49._12_4_ + fStack_ac;
                auVar42._0_4_ = auVar42._0_4_ + auVar33._0_4_;
                auVar42._4_4_ = fVar45 + auVar33._4_4_;
                auVar42._8_4_ = fVar46 + auVar33._8_4_;
                auVar42._12_4_ = fVar47 + auVar33._12_4_;
                auVar31._0_4_ = auVar33._0_4_ + auVar31._0_4_;
                auVar31._4_4_ = auVar33._4_4_ + auVar31._4_4_;
                auVar31._8_4_ = auVar33._8_4_ + auVar31._8_4_;
                auVar31._12_4_ = auVar33._12_4_ + auVar31._12_4_;
                sVar22 = sVar22 + 1;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            else {
            }
          }
          auVar10._4_4_ = -(uint)(auVar48._4_4_ <= auVar42._4_4_);
          auVar10._0_4_ = -(uint)(auVar48._0_4_ <= auVar42._0_4_);
          auVar10._8_4_ = -(uint)(auVar48._8_4_ <= auVar42._8_4_);
          auVar10._12_4_ = -(uint)(auVar48._12_4_ <= auVar42._12_4_);
          uVar12 = movmskps(uVar19,auVar10);
          if (((~(byte)uVar12 & 7) == 0) &&
             (auVar11._4_4_ = -(uint)(auVar43._4_4_ <= auVar31._4_4_),
             auVar11._0_4_ = -(uint)(auVar43._0_4_ <= auVar31._0_4_),
             auVar11._8_4_ = -(uint)(auVar43._8_4_ <= auVar31._8_4_),
             auVar11._12_4_ = -(uint)(auVar43._12_4_ <= auVar31._12_4_),
             uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar11),
             (~(byte)uVar12 & 7) == 0)) {
            auVar49 = minps(auVar48,auVar43);
            auVar43 = maxps(auVar42,auVar31);
            aVar50._0_12_ = auVar49._0_12_;
            aVar50.m128[3] = (float)geomID;
            aVar44._0_12_ = auVar43._0_12_;
            aVar44.m128[3] = (float)uVar23;
            auVar25._0_4_ = auVar49._0_4_ + auVar43._0_4_;
            auVar25._4_4_ = auVar49._4_4_ + auVar43._4_4_;
            auVar25._8_4_ = auVar49._8_4_ + auVar43._8_4_;
            auVar25._12_4_ = (float)geomID + (float)uVar23;
            local_138 = minps(local_138,(undefined1  [16])aVar50);
            local_148 = maxps(local_148,(undefined1  [16])aVar44);
            local_158 = minps(local_158,auVar25);
            local_168 = maxps(local_168,auVar25);
            local_188 = local_188 + 1;
            prims[local_180].lower.field_0 = aVar50;
            prims[local_180].upper.field_0 = aVar44;
            local_180 = local_180 + 1;
          }
        }
LAB_00a94f80:
        uVar23 = uVar23 + 1;
      } while (uVar23 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_138._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_138._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_148._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_148._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_158._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_158._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_168._8_8_;
    __return_storage_ptr__->end = local_188;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }